

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Microdisc.cpp
# Opt level: O0

void __thiscall
Oric::Microdisc::set_control_register(Microdisc *this,uint8_t control,uint8_t changes)

{
  bool bVar1;
  bool bVar2;
  PagedItem local_54;
  PagedItem item;
  bool has_irq;
  bool had_irq;
  anon_class_4_1_898c7ade local_3c;
  function<void_(Storage::Disk::Drive_&,_unsigned_long)> local_38;
  uint local_18;
  byte local_12;
  byte local_11;
  int head;
  uint8_t changes_local;
  uint8_t control_local;
  Microdisc *this_local;
  
  local_12 = changes;
  local_11 = control;
  _head = this;
  if (((int)(uint)changes >> 5 & 3U) != 0) {
    Storage::Disk::Controller::set_drive
              ((Controller *)this,1 << (sbyte)((int)(uint)control >> 5) & 3);
  }
  if ((local_12 & 0x10) != 0) {
    local_3c.head = (local_11 & 0x10) >> 4;
    local_18 = local_3c.head;
    std::function<void(Storage::Disk::Drive&,unsigned_long)>::
    function<Oric::Microdisc::set_control_register(unsigned_char,unsigned_char)::__0,void>
              ((function<void(Storage::Disk::Drive&,unsigned_long)> *)&local_38,&local_3c);
    Storage::Disk::Controller::for_all_drives((Controller *)this,&local_38);
    std::function<void_(Storage::Disk::Drive_&,_unsigned_long)>::~function(&local_38);
  }
  if ((local_12 & 8) != 0) {
    Storage::Disk::MFMController::set_is_double_density
              ((MFMController *)this,(bool)(((local_11 & 8) != 0 ^ 0xffU) & 1));
  }
  if ((local_12 & 1) != 0) {
    bVar1 = get_interrupt_request_line(this);
    (this->super_DiskController).field_0x4e5 = (local_11 & 1) != 0;
    bVar2 = get_interrupt_request_line(this);
    if ((bVar2 != bVar1) && ((this->super_DiskController).delegate_ != (Delegate *)0x0)) {
      (**(((this->super_DiskController).delegate_)->super_Delegate)._vptr_Delegate)();
    }
  }
  if ((local_12 & 0x82) != 0) {
    if ((local_11 & 2) == 0) {
      if ((local_11 & 0x80) == 0) {
        local_54 = DiskROM;
      }
      else {
        local_54 = RAM;
      }
    }
    else {
      local_54 = BASIC;
    }
    DiskController::set_paged_item(&this->super_DiskController,local_54);
  }
  return;
}

Assistant:

void Microdisc::set_control_register(uint8_t control, uint8_t changes) {
	// b2: data separator clock rate select (1 = double)	[TODO]

	// b65: drive select
	if((changes >> 5)&3) {
		set_drive(1 << (control >> 5)&3);
	}

	// b4: side select
	if(changes & 0x10) {
		const int head = (control & 0x10) >> 4;
		for_all_drives([head] (Storage::Disk::Drive &drive, size_t) {
			drive.set_head(head);
		});
	}

	// b3: double density select (0 = double)
	if(changes & 0x08) {
		set_is_double_density(!(control & 0x08));
	}

	// b0: IRQ enable
	if(changes & 0x01) {
		const bool had_irq = get_interrupt_request_line();
		irq_enable_ = bool(control & 0x01);
		const bool has_irq = get_interrupt_request_line();
		if(has_irq != had_irq && delegate_) {
			delegate_->wd1770_did_change_output(this);
		}
	}

	// b7: EPROM select (0 = select)
	// b1: ROM disable (0 = disable)
	if(changes & 0x82) {
		PagedItem item;
		if(control & 0x02) item = PagedItem::BASIC;
		else if(control & 0x80) {
			item = PagedItem::RAM;
		} else {
			item = PagedItem::DiskROM;
		}
		set_paged_item(item);
	}
}